

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_feat_digging(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  wchar_t dig_idx;
  feature *f;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  wVar1 = parser_getint(p,"dig");
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if ((wVar1 < L'\x01') || (L'\x05' < wVar1)) {
    p_local._4_4_ = PARSE_ERROR_OUT_OF_BOUNDS;
  }
  else {
    *(char *)((long)pvVar2 + 0x22) = (char)wVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_feat_digging(struct parser *p) {
	struct feature *f = parser_priv(p);
	int dig_idx = parser_getint(p, "dig");

	if (!f)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (dig_idx < DIGGING_RUBBLE + 1 || dig_idx >= DIGGING_MAX + 1) {
		return PARSE_ERROR_OUT_OF_BOUNDS;
	}
	f->dig = dig_idx;
	return PARSE_ERROR_NONE;
}